

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O2

bilingual_str * __thiscall
util::ErrorString<std::unique_ptr<AddrMan,std::default_delete<AddrMan>>>
          (bilingual_str *__return_storage_ptr__,util *this,
          Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *result)

{
  long lVar1;
  variant_alternative_t<0UL,_variant<bilingual_str,_unique_ptr<AddrMan,_default_delete<AddrMan>_>_>_>
  *pvVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this[0x40] == (util)0x1) {
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    (__return_storage_ptr__->original)._M_string_length = 0;
    (__return_storage_ptr__->original).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    (__return_storage_ptr__->translated)._M_string_length = 0;
    (__return_storage_ptr__->translated).field_2._M_local_buf[0] = '\0';
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    pvVar2 = std::get<0ul,bilingual_str,std::unique_ptr<AddrMan,std::default_delete<AddrMan>>>
                       ((variant<bilingual_str,_std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_>
                         *)this);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      bilingual_str::bilingual_str(__return_storage_ptr__,pvVar2);
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str ErrorString(const Result<T>& result)
{
    return result ? bilingual_str{} : std::get<0>(result.m_variant);
}